

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arm.cpp
# Opt level: O0

void __thiscall arm::ArmCode::display(ArmCode *this,ostream *o)

{
  bool bVar1;
  ostream *poVar2;
  reference ppVar3;
  ostream *in_RSI;
  long in_RDI;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_arm::ConstValue>
  *v;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_arm::ConstValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_arm::ConstValue>_>_>
  *__range1_1;
  unique_ptr<arm::Function,_std::default_delete<arm::Function>_> *f;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::unique_ptr<arm::Function,_std::default_delete<arm::Function>_>,_std::allocator<std::unique_ptr<arm::Function,_std::default_delete<arm::Function>_>_>_>
  *__range1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_arm::ConstValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_arm::ConstValue>_>_>
  *in_stack_ffffffffffffff98;
  ostream *in_stack_ffffffffffffffa0;
  _Self local_48;
  _Self local_40;
  long local_38;
  reference local_30;
  unique_ptr<arm::Function,_std::default_delete<arm::Function>_> *local_28;
  __normal_iterator<const_std::unique_ptr<arm::Function,_std::default_delete<arm::Function>_>_*,_std::vector<std::unique_ptr<arm::Function,_std::default_delete<arm::Function>_>,_std::allocator<std::unique_ptr<arm::Function,_std::default_delete<arm::Function>_>_>_>_>
  local_20;
  long local_18;
  ostream *local_10;
  
  local_10 = in_RSI;
  poVar2 = std::operator<<(in_RSI,".text");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  local_18 = in_RDI + 8;
  local_20._M_current =
       (unique_ptr<arm::Function,_std::default_delete<arm::Function>_> *)
       std::
       vector<std::unique_ptr<arm::Function,_std::default_delete<arm::Function>_>,_std::allocator<std::unique_ptr<arm::Function,_std::default_delete<arm::Function>_>_>_>
       ::begin((vector<std::unique_ptr<arm::Function,_std::default_delete<arm::Function>_>,_std::allocator<std::unique_ptr<arm::Function,_std::default_delete<arm::Function>_>_>_>
                *)in_stack_ffffffffffffff98);
  local_28 = (unique_ptr<arm::Function,_std::default_delete<arm::Function>_> *)
             std::
             vector<std::unique_ptr<arm::Function,_std::default_delete<arm::Function>_>,_std::allocator<std::unique_ptr<arm::Function,_std::default_delete<arm::Function>_>_>_>
             ::end((vector<std::unique_ptr<arm::Function,_std::default_delete<arm::Function>_>,_std::allocator<std::unique_ptr<arm::Function,_std::default_delete<arm::Function>_>_>_>
                    *)in_stack_ffffffffffffff98);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_std::unique_ptr<arm::Function,_std::default_delete<arm::Function>_>_*,_std::vector<std::unique_ptr<arm::Function,_std::default_delete<arm::Function>_>,_std::allocator<std::unique_ptr<arm::Function,_std::default_delete<arm::Function>_>_>_>_>
                        *)in_stack_ffffffffffffffa0,
                       (__normal_iterator<const_std::unique_ptr<arm::Function,_std::default_delete<arm::Function>_>_*,_std::vector<std::unique_ptr<arm::Function,_std::default_delete<arm::Function>_>,_std::allocator<std::unique_ptr<arm::Function,_std::default_delete<arm::Function>_>_>_>_>
                        *)in_stack_ffffffffffffff98);
    if (!bVar1) break;
    local_30 = __gnu_cxx::
               __normal_iterator<const_std::unique_ptr<arm::Function,_std::default_delete<arm::Function>_>_*,_std::vector<std::unique_ptr<arm::Function,_std::default_delete<arm::Function>_>,_std::allocator<std::unique_ptr<arm::Function,_std::default_delete<arm::Function>_>_>_>_>
               ::operator*(&local_20);
    in_stack_ffffffffffffffa0 = local_10;
    std::unique_ptr<arm::Function,_std::default_delete<arm::Function>_>::operator*
              ((unique_ptr<arm::Function,_std::default_delete<arm::Function>_> *)local_10);
    poVar2 = prelude::operator<<(in_stack_ffffffffffffffa0,(Displayable *)in_stack_ffffffffffffff98)
    ;
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    __gnu_cxx::
    __normal_iterator<const_std::unique_ptr<arm::Function,_std::default_delete<arm::Function>_>_*,_std::vector<std::unique_ptr<arm::Function,_std::default_delete<arm::Function>_>,_std::allocator<std::unique_ptr<arm::Function,_std::default_delete<arm::Function>_>_>_>_>
    ::operator++(&local_20);
  }
  poVar2 = std::operator<<(local_10,".data");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  local_38 = in_RDI + 0x20;
  local_40._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_arm::ConstValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_arm::ConstValue>_>_>
       ::begin(in_stack_ffffffffffffff98);
  local_48._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_arm::ConstValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_arm::ConstValue>_>_>
       ::end(in_stack_ffffffffffffff98);
  while( true ) {
    bVar1 = std::operator!=(&local_40,&local_48);
    if (!bVar1) break;
    ppVar3 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_arm::ConstValue>_>
             ::operator*((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_arm::ConstValue>_>
                          *)in_stack_ffffffffffffffa0);
    poVar2 = std::operator<<(local_10,(string *)ppVar3);
    poVar2 = std::operator<<(poVar2,":");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    poVar2 = prelude::operator<<(in_stack_ffffffffffffffa0,(Displayable *)in_stack_ffffffffffffff98)
    ;
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_arm::ConstValue>_>
    ::operator++((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_arm::ConstValue>_>
                  *)in_stack_ffffffffffffffa0);
  }
  std::ostream::operator<<(local_10,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void ArmCode::display(std::ostream &o) const {
  o << ".text" << std::endl;
  for (auto &f : functions) {
    o << *f << std::endl;
  }

  o << ".data" << std::endl;
  for (auto &v : this->consts) {
    o << v.first << ":" << std::endl;
    o << v.second << std::endl;
  }
  o << std::endl;
}